

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

char * glcts::GetModeStr(GLenum mode)

{
  if (mode - 0x9294 < 0x1d) {
    return &DAT_01bc5060 + *(int *)(&DAT_01bc5060 + (ulong)(mode - 0x9294) * 4);
  }
  return "Blend mode not from GL_KHR_blend_equation_advanced.";
}

Assistant:

static const char* GetModeStr(glw::GLenum mode)
{
	switch (mode)
	{
	case GL_MULTIPLY_KHR:
		return "GL_MULTIPLY_KHR";
	case GL_SCREEN_KHR:
		return "GL_SCREEN_KHR";
	case GL_OVERLAY_KHR:
		return "GL_OVERLAY_KHR";
	case GL_DARKEN_KHR:
		return "GL_DARKEN_KHR";
	case GL_LIGHTEN_KHR:
		return "GL_LIGHTEN_KHR";
	case GL_COLORDODGE_KHR:
		return "GL_COLORDODGE_KHR";
	case GL_COLORBURN_KHR:
		return "GL_COLORBURN_KHR";
	case GL_HARDLIGHT_KHR:
		return "GL_HARDLIGHT_KHR";
	case GL_SOFTLIGHT_KHR:
		return "GL_SOFTLIGHT_KHR";
	case GL_DIFFERENCE_KHR:
		return "GL_DIFFERENCE_KHR";
	case GL_EXCLUSION_KHR:
		return "GL_EXCLUSION_KHR";
	case GL_HSL_HUE_KHR:
		return "GL_HSL_HUE_KHR";
	case GL_HSL_SATURATION_KHR:
		return "GL_HSL_SATURATION_KHR";
	case GL_HSL_COLOR_KHR:
		return "GL_HSL_COLOR_KHR";
	case GL_HSL_LUMINOSITY_KHR:
		return "GL_HSL_LUMINOSITY_KHR";
	default:
		DE_ASSERT(DE_FALSE && "Blend mode not from GL_KHR_blend_equation_advanced.");
		return "Blend mode not from GL_KHR_blend_equation_advanced.";
	}
}